

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::Parse(Parser *this,ZeroCopyInputStream *input,Message *output)

{
  bool bVar1;
  Descriptor *root_message_type;
  undefined1 local_148 [8];
  ParserImpl parser;
  SingularOverwritePolicy overwrites_policy;
  Message *output_local;
  ZeroCopyInputStream *input_local;
  Parser *this_local;
  
  (*(output->super_MessageLite)._vptr_MessageLite[7])();
  parser._252_4_ = (byte)~this->allow_singular_overwrites_ & 1;
  root_message_type = Message::GetDescriptor(output);
  ParserImpl::ParserImpl
            ((ParserImpl *)local_148,root_message_type,input,this->error_collector_,this->finder_,
             this->parse_info_tree_,parser._252_4_,(bool)(this->allow_case_insensitive_field_ & 1),
             (bool)(this->allow_unknown_field_ & 1),(bool)(this->allow_unknown_enum_ & 1),
             (bool)(this->allow_field_number_ & 1),(bool)(this->allow_relaxed_whitespace_ & 1),
             (bool)(this->allow_partial_ & 1));
  bVar1 = MergeUsingImpl(this,input,output,(ParserImpl *)local_148);
  ParserImpl::~ParserImpl((ParserImpl *)local_148);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::Parse(io::ZeroCopyInputStream* input,
                               Message* output) {
  output->Clear();

  ParserImpl::SingularOverwritePolicy overwrites_policy =
      allow_singular_overwrites_
      ? ParserImpl::ALLOW_SINGULAR_OVERWRITES
      : ParserImpl::FORBID_SINGULAR_OVERWRITES;

  ParserImpl parser(output->GetDescriptor(), input, error_collector_,
                    finder_, parse_info_tree_,
                    overwrites_policy,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_enum_, allow_field_number_,
                    allow_relaxed_whitespace_, allow_partial_);
  return MergeUsingImpl(input, output, &parser);
}